

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeDeltaTo(UCharsTrieBuilder *this,int32_t jumpTarget)

{
  int iVar1;
  ssize_t sVar2;
  ushort uVar3;
  size_t __n;
  uint uVar4;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)(uint)jumpTarget;
  uVar4 = this->ucharsLength - jumpTarget;
  if ((int)uVar4 < 0xfc00) {
    iVar1 = (*(this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf])();
    return iVar1;
  }
  uVar3 = (ushort)(uVar4 >> 0x10);
  if (uVar4 < 0x3ff0000) {
    uVar3 = uVar3 | 0xfc00;
    __n = 1;
  }
  else {
    uStack_8._0_6_ = CONCAT24(uVar3,jumpTarget);
    uStack_8 = (ulong)(uint6)uStack_8;
    __n = 2;
    uVar3 = 0xffff;
  }
  uStack_8._0_4_ = CONCAT22(uVar3,(undefined2)uStack_8);
  *(short *)((long)&uStack_8 + __n * 2 + 2) = (short)uVar4;
  sVar2 = write(this,(int)&uStack_8 + 2,(void *)(ulong)((int)__n + 1),__n);
  return (int32_t)sVar2;
}

Assistant:

int32_t
UCharsTrieBuilder::writeDeltaTo(int32_t jumpTarget) {
    int32_t i=ucharsLength-jumpTarget;
    U_ASSERT(i>=0);
    if(i<=UCharsTrie::kMaxOneUnitDelta) {
        return write(i);
    }
    UChar intUnits[3];
    int32_t length;
    if(i<=UCharsTrie::kMaxTwoUnitDelta) {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitDeltaLead+(i>>16));
        length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitDeltaLead);
        intUnits[1]=(UChar)(i>>16);
        length=2;
    }
    intUnits[length++]=(UChar)i;
    return write(intUnits, length);
}